

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall
inja::InjaError::InjaError(InjaError *this,string *type,string *message,SourceLocation location)

{
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::operator+(&local_50,"[inja.exception.",type);
  ::std::operator+(&local_110,&local_50,"] (at ");
  std::__cxx11::to_string(&local_130,location.line);
  ::std::operator+(&local_f0,&local_110,&local_130);
  ::std::operator+(&local_d0,&local_f0,":");
  std::__cxx11::to_string(&local_150,location.column);
  ::std::operator+(&local_b0,&local_d0,&local_150);
  ::std::operator+(&local_90,&local_b0,") ");
  ::std::operator+(&local_70,&local_90,message);
  ::std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_150);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::__cxx11::string::~string((string *)&local_130);
  ::std::__cxx11::string::~string((string *)&local_110);
  ::std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)this = &PTR__InjaError_0019c248;
  ::std::__cxx11::string::string((string *)&this->type,(string *)type);
  ::std::__cxx11::string::string((string *)&this->message,(string *)message);
  (this->location).line = location.line;
  (this->location).column = location.column;
  return;
}

Assistant:

explicit InjaError(const std::string& type, const std::string& message, SourceLocation location)
      : std::runtime_error("[inja.exception." + type + "] (at " + std::to_string(location.line) + ":" + std::to_string(location.column) + ") " + message),
        type(type), message(message), location(location) {}